

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  int iVar1;
  
  secp256k1_fe_verify(r);
  secp256k1_fe_verify(a);
  iVar1 = a->magnitude + r->magnitude;
  if (iVar1 < 0x21) {
    r->n[0] = r->n[0] + a->n[0];
    r->n[1] = r->n[1] + a->n[1];
    r->n[2] = r->n[2] + a->n[2];
    r->n[3] = r->n[3] + a->n[3];
    r->n[4] = r->n[4] + a->n[4];
    r->magnitude = iVar1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/field_impl.h"
          ,0x146,"test condition failed: r->magnitude + a->magnitude <= 32");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(r->magnitude + a->magnitude <= 32);

    secp256k1_fe_impl_add(r, a);
    r->magnitude += a->magnitude;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}